

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void kj::
     ctor<capnp::compiler::Compiler::Node,kj::StringPtr&,capnp::compiler::Declaration::Which&,capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
               (Node *location,StringPtr *params,Which *params_1,Reader *params_2)

{
  Which kind;
  ArrayPtr<const_char> name;
  Node *this;
  ArrayPtr<const_char> *pAVar1;
  Which *pWVar2;
  ListReader *pLVar3;
  Reader *params_local_2;
  Which *params_local_1;
  StringPtr *params_local;
  Node *location_local;
  
  this = (Node *)operator_new(0x1c0);
  if (this != (Node *)0x0) {
    pAVar1 = &fwd<kj::StringPtr&>(params)->content;
    name = *pAVar1;
    pWVar2 = fwd<capnp::compiler::Declaration::Which&>(params_1);
    kind = *pWVar2;
    pLVar3 = &fwd<capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
                        (params_2)->reader;
    capnp::compiler::Compiler::Node::Node(this,(StringPtr)name,kind,(Reader)*pLVar3);
  }
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}